

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall SQASTReader::readTableBody(SQASTReader *this,TableDecl *table)

{
  uint32_t keys;
  TableDecl *pTVar1;
  Expr *key_00;
  Expr *value_00;
  TableDecl *in_RSI;
  SQASTReader *in_RDI;
  uint flags;
  Expr *value;
  Expr *key;
  size_t i;
  size_t size;
  size_type_conflict in_stack_ffffffffffffffbc;
  TableDecl *this_00;
  
  pTVar1 = (TableDecl *)InputStream::readUIntptr((InputStream *)0x1433b1);
  SQCompilation::TableDecl::members(in_RSI);
  ArenaVector<SQCompilation::TableMember>::resize
            ((ArenaVector<SQCompilation::TableMember> *)in_RDI,in_stack_ffffffffffffffbc);
  for (this_00 = (TableDecl *)0x0; this_00 < pTVar1;
      this_00 = (TableDecl *)
                ((long)&(this_00->super_Decl).super_Statement.super_Node.super_ArenaObj.
                        _vptr_ArenaObj + 1)) {
    key_00 = readExpression(in_RDI);
    value_00 = readExpression(in_RDI);
    keys = InputStream::readUInt32((InputStream *)0x143413);
    SQCompilation::TableDecl::addMember(this_00,key_00,value_00,keys);
  }
  return;
}

Assistant:

void SQASTReader::readTableBody(TableDecl *table) {
  size_t size = stream->readUIntptr();
  table->members().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *key = readExpression();
    Expr *value = readExpression();
    unsigned flags = stream->readUInt32();

    table->addMember(key, value, flags);
  }
}